

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

unsigned_long
arangodb::velocypack::readIntegerNonEmpty<unsigned_long>(uint8_t *start,ValueLength length)

{
  undefined8 in_RSI;
  byte *in_RDI;
  ulong local_8;
  
  switch(in_RSI) {
  case 1:
    local_8 = (ulong)*in_RDI;
    break;
  case 2:
    local_8 = readIntegerFixed<unsigned_long,2ul>((uint8_t *)0x11a8e6);
    break;
  case 3:
    local_8 = readIntegerFixed<unsigned_long,3ul>((uint8_t *)0x11a8f7);
    break;
  case 4:
    local_8 = readIntegerFixed<unsigned_long,4ul>((uint8_t *)0x11a908);
    break;
  case 5:
    local_8 = readIntegerFixed<unsigned_long,5ul>(in_RDI);
    break;
  case 6:
    local_8 = readIntegerFixed<unsigned_long,6ul>(in_RDI);
    break;
  case 7:
    local_8 = readIntegerFixed<unsigned_long,7ul>(in_RDI);
    break;
  case 8:
    local_8 = readIntegerFixed<unsigned_long,8ul>(in_RDI);
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static inline T readIntegerNonEmpty(uint8_t const* start,
                                    ValueLength length) noexcept {
  static_assert(std::is_unsigned<T>::value, "result type must be unsigned");
  VELOCYPACK_ASSERT(length > 0);
  VELOCYPACK_ASSERT(length <= sizeof(T));
  VELOCYPACK_ASSERT(length <= 8);
  switch (length) {
    case 1:
      return *start;
    case 2:
      return readIntegerFixed<T, 2>(start);
    case 3:
      return readIntegerFixed<T, 3>(start);
    case 4:
      return readIntegerFixed<T, 4>(start);
    case 5:
      return readIntegerFixed<T, 5>(start);
    case 6:
      return readIntegerFixed<T, 6>(start);
    case 7:
      return readIntegerFixed<T, 7>(start);
    case 8:
      return readIntegerFixed<T, 8>(start);
  }
  VELOCYPACK_ASSERT(false);
  return 0;
}